

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestIntIntMap>_>
::MapSorterPtr(MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestIntIntMap>_>
               *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestIntIntMap>
                     *m)

{
  uint uVar1;
  uint uVar2;
  NodeBase **ppNVar3;
  long lVar4;
  void **ppvVar5;
  uint uVar6;
  ulong uVar7;
  NodeBase *pNVar8;
  void **ppvVar9;
  ulong uVar10;
  
  uVar1 = (m->
          super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_UntypedMapBase.num_elements_;
  uVar10 = (ulong)uVar1;
  this->size_ = uVar10;
  if (uVar10 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)operator_new__(uVar10 * 8);
  }
  (this->items_)._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t
  .super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
  super__Head_base<0UL,_const_void_**,_false>._M_head_impl = ppvVar5;
  if (uVar10 != 0) {
    uVar2 = (m->
            super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_UntypedMapBase.num_buckets_;
    uVar6 = (m->
            super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_UntypedMapBase.index_of_first_non_null_;
    uVar7 = (ulong)uVar6;
    if (uVar6 == uVar2) {
      uVar7 = 0;
      pNVar8 = (NodeBase *)0x0;
    }
    else {
      pNVar8 = (m->
               super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).super_UntypedMapBase.table_[uVar7];
      if (pNVar8 == (NodeBase *)0x0) {
        protobuf_assumption_failed
                  ("node != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                   ,0x22e);
      }
    }
    if (pNVar8 != (NodeBase *)0x0) {
      ppNVar3 = (m->
                super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).super_UntypedMapBase.table_;
      ppvVar9 = ppvVar5;
      do {
        *ppvVar9 = pNVar8 + 1;
        pNVar8 = pNVar8->next;
        while (pNVar8 == (NodeBase *)0x0) {
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          if (uVar2 <= uVar6) {
            pNVar8 = (NodeBase *)0x0;
            uVar7 = 0;
            break;
          }
          pNVar8 = ppNVar3[uVar6];
        }
        ppvVar9 = ppvVar9 + 1;
      } while (pNVar8 != (NodeBase *)0x0);
    }
    lVar4 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar1 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<void_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterPtrLessThan<std::__cxx11::string>>>
              (ppvVar5,ppvVar5 + uVar10,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<void_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapSorterPtrLessThan<std::__cxx11::string>>>
              (ppvVar5,ppvVar5 + uVar10);
  }
  return;
}

Assistant:

explicit MapSorterPtr(const MapT& m)
      : size_(m.size()), items_(size_ ? new storage_type[size_] : nullptr) {
    if (!size_) return;
    storage_type* it = &items_[0];
    for (const auto& entry : m) {
      *it++ = &entry;
    }
    static_assert(PROTOBUF_FIELD_OFFSET(typename MapT::value_type, first) == 0,
                  "Must hold for MapSorterPtrLessThan to work.");
    std::sort(&items_[0], &items_[size_],
              MapSorterPtrLessThan<typename MapT::key_type>{});
  }